

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectbox.hpp
# Opt level: O0

TreePutResult obx::internal::mapErrorToTreePutResult(obx_err err)

{
  undefined4 local_c;
  obx_err err_local;
  
  if (err == 0) {
    local_c = Success;
  }
  else if (err == 0x194) {
    local_c = PathNotFound;
  }
  else if (err == 0x3e9) {
    local_c = DidNotPut;
  }
  else {
    local_c = Undefined;
  }
  return local_c;
}

Assistant:

TreePutResult mapErrorToTreePutResult(obx_err err) {
    if (err == OBX_SUCCESS) {
        return TreePutResult::Success;
    } else if (err == OBX_NOT_FOUND) {
        return TreePutResult::PathNotFound;
    } else if (err == OBX_NO_SUCCESS) {
        return TreePutResult::DidNotPut;
    } else {
        return TreePutResult::Undefined;
    }
}